

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::read1To10(string *str,size_t *index)

{
  int iVar1;
  const_iterator __s;
  const_iterator __n1;
  __tuple_element_t<2UL,_tuple<const_char_*,_double,_int>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<const_char_*,_double,_int>_> *p_Var3;
  long *in_RSI;
  value_type *num;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_double,_int>,_9UL> *__range1;
  const_iterator __pos;
  undefined1 *this;
  
  this = lt10;
  __s = std::array<std::tuple<const_char_*,_double,_int>,_9UL>::begin
                  ((array<std::tuple<const_char_*,_double,_int>,_9UL> *)0x7aa846);
  __n1 = std::array<std::tuple<const_char_*,_double,_int>,_9UL>::end
                   ((array<std::tuple<const_char_*,_double,_int>,_9UL> *)0x7aa857);
  while( true ) {
    if (__s == __n1) {
      return NAN;
    }
    __pos = __s;
    std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x7aa897);
    std::get<0ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x7aa8a9);
    iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                    (size_type)__pos,(size_type)__n1,(char *)__s);
    if (iVar1 == 0) break;
    __s = __pos + 1;
  }
  p_Var2 = std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x7aa8cf);
  *in_RSI = (long)*p_Var2 + *in_RSI;
  p_Var3 = std::get<1ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x7aa8e7);
  return *p_Var3;
}

Assistant:

static double read1To10(const std::string& str, size_t& index)
{
    for (const auto& num : lt10) {
        if (str.compare(index, std::get<2>(num), std::get<0>(num)) == 0) {
            index += std::get<2>(num);
            return std::get<1>(num);
        }
    }
    return constants::invalid_conversion;
}